

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcsloop.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool use_cusum;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  NaPNEvent NVar9;
  char *pcVar10;
  size_t sVar11;
  undefined8 uVar12;
  undefined8 *puVar13;
  long *plVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  NaControllerKind local_6748;
  double local_6740;
  int local_672c;
  NaVector vInitial;
  NaParams par;
  NaStateSpaceModel au_ssmplant;
  NaStateSpaceModel au_ssmcontr;
  NaNNUnit au_nnp;
  uint local_6050;
  uint local_604c;
  NaControlSystemModel csm;
  NaCombinedFunc au_linplant;
  NaCombinedFunc noise_tf;
  NaCombinedFunc refer_tf;
  NaNNUnit au_nnc;
  uint local_a78;
  NaCombinedFunc au_lincontr;
  
  if (argc < 2) {
    fwrite("Usage: dcsloop ParamFile [Extra name=value pairs]\n",0x32,1,_stderr);
    return 1;
  }
  NaParams::NaParams(&par,argv[1],argc + -2,argv + 2,"#=");
  NaPrintLog("Run dcsloop with %s\n",argv[1]);
  NaParams::ListOfParamsToLog();
  pcVar10 = (char *)NaParams::GetParam((char *)&par);
  iVar2 = strcmp("lin",pcVar10);
  if (iVar2 == 0) {
    pcVar10 = "Using linear controller in control system loop\n";
  }
  else {
    pcVar10 = (char *)NaParams::GetParam((char *)&par);
    iVar3 = strcmp("nnc",pcVar10);
    if (iVar3 != 0) {
      NaPrintLog("Bad or undefined contr_kind value in .par file\n");
      goto LAB_00106c57;
    }
    pcVar10 = "Using neural net controller in control system loop\n";
  }
  NaPrintLog(pcVar10);
  pcVar10 = (char *)NaParams::GetParam((char *)&par);
  iVar3 = strcmp("stream",pcVar10);
  if (iVar3 == 0) {
    pcVar10 = "Using stream reference and noise (transfer functions)\n";
  }
  else {
    pcVar10 = (char *)NaParams::GetParam((char *)&par);
    iVar4 = strcmp("file",pcVar10);
    if (iVar4 != 0) {
      NaPrintLog("Bad or undefined input_kind value in .par file\n");
      goto LAB_00106c57;
    }
    pcVar10 = "Using limited reference and noise series (data files)\n";
  }
  NaPrintLog(pcVar10);
  NaCombinedFunc::NaCombinedFunc(&refer_tf);
  NaCombinedFunc::NaCombinedFunc(&noise_tf);
  NaCombinedFunc::NaCombinedFunc(&au_linplant);
  NaCombinedFunc::NaCombinedFunc(&au_lincontr);
  NaStateSpaceModel::NaStateSpaceModel(&au_ssmcontr);
  NaStateSpaceModel::NaStateSpaceModel(&au_ssmplant);
  NaNNUnit::NaNNUnit(&au_nnc);
  NaNNUnit::NaNNUnit(&au_nnp);
  pcVar10 = (char *)NaParams::GetParam((char *)&par);
  sVar11 = strlen(pcVar10);
  iVar4 = strcmp(pcVar10 + (sVar11 - 4),".ssm");
  if (iVar4 == 0) {
    NaStateSpaceModel::Load((char *)&au_ssmplant);
  }
  else {
    NaCombinedFunc::Load((char *)&au_linplant);
  }
  NaVector::NaVector(&vInitial,1);
  if (iVar2 == 0) {
    pcVar10 = (char *)NaParams::GetParam((char *)&par);
    sVar11 = strlen(pcVar10);
    iVar5 = strcmp(pcVar10 + (sVar11 - 4),".ssm");
    if (iVar5 == 0) {
      NaStateSpaceModel::Load((char *)&au_ssmcontr);
    }
    else {
      NaCombinedFunc::Load((char *)&au_lincontr);
    }
    NaVector::init_zero();
    cVar1 = NaParams::CheckParam((char *)&par);
    if ((cVar1 != '\0') || (cVar1 = NaParams::CheckParam((char *)&par), cVar1 != '\0')) {
      pcVar10 = (char *)NaParams::GetParam((char *)&par);
      dVar20 = atof(pcVar10);
      NaVector::init_value(dVar20);
    }
    local_6748 = NaLinearContr;
  }
  else {
    NaParams::GetParam((char *)&par);
    NaNNUnit::Load((char *)&au_nnc);
    pcVar10 = (char *)NaParams::GetParam((char *)&par);
    iVar5 = strcmp(pcVar10,"e+r+se");
    local_6748 = NaNeuralContrERSumE;
    if ((iVar5 != 0) && (iVar5 = strcmp(pcVar10,"r+e+se"), iVar5 != 0)) {
      iVar5 = strcmp(pcVar10,"e+r");
      local_6748 = NaNeuralContrER;
      if ((iVar5 != 0) && (iVar5 = strcmp(pcVar10,"r+e"), iVar5 != 0)) {
        iVar5 = strcmp(pcVar10,"e+de");
        if (iVar5 == 0) {
          local_6748 = NaNeuralContrEdE;
        }
        else {
          iVar5 = strcmp(pcVar10,"e+e+...");
          local_6748 = NaNeuralContrER - (iVar5 == 0 || 1 < local_a78);
        }
      }
    }
  }
  local_672c = 0;
  if (iVar3 == 0) {
    NaParams::GetParam((char *)&par);
    NaCombinedFunc::Load((char *)&refer_tf);
    NaParams::GetParam((char *)&par);
    NaCombinedFunc::Load((char *)&noise_tf);
    pcVar10 = (char *)NaParams::GetParam((char *)&par);
    local_672c = atoi(pcVar10);
  }
  use_cusum = (bool)NaParams::CheckParam((char *)&par);
  pcVar10 = (char *)NaParams::GetParam((char *)&par);
  uVar6 = atoi(pcVar10);
  pcVar10 = (char *)NaParams::GetParam((char *)&par);
  uVar15 = 1;
  if (use_cusum != false) {
    uVar15 = uVar6;
  }
  pcVar19 = "OFF";
  if (use_cusum != false) {
    pcVar19 = "ON";
  }
  uVar16 = uVar15;
  if ((int)uVar6 < 1) {
    uVar16 = 1;
  }
  if (use_cusum == false) {
    uVar16 = uVar15;
  }
  dVar21 = atof(pcVar10);
  local_6740 = 0.0;
  dVar20 = 0.0;
  if (0.0 <= dVar21) {
    dVar20 = dVar21;
  }
  uVar15 = 0;
  if (0 < (int)uVar16) {
    uVar15 = uVar16;
  }
  for (uVar18 = 1; (int)uVar18 - uVar15 != 1; uVar18 = (ulong)((int)uVar18 + 1)) {
    NaPrintLog("Run %d (of %d)\n",uVar18,(ulong)uVar16);
    NaControlSystemModel::NaControlSystemModel(&csm,local_672c,local_6748);
    if (iVar4 == 0) {
      NaPrintLog("plant SS model\n");
      NaControlSystemModel::set_plant_ss_model(&csm,&au_ssmplant);
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 == '\0') {
        NaPrintLog("Warning: \'out_x\' parameter is not defined, \'out_x_default.dat\' file is used"
                  );
        NaPNFileOutput::set_output_filename((char *)&csm.plant_x);
      }
      else {
        NaParams::GetParam((char *)&par);
        NaPNFileOutput::set_output_filename((char *)&csm.plant_x);
      }
    }
    else {
      NaPrintLog("plant TF or COF function\n");
      NaControlSystemModel::set_plant_function(&csm,&au_linplant);
    }
    cVar1 = NaParams::CheckParam((char *)&par);
    if (cVar1 == '\0') {
      NaPNFileOutput::set_output_filename((char *)&csm.cerr_fout);
    }
    else {
      uVar12 = NaParams::GetParam((char *)&par);
      NaPrintLog("Writing control error statistics to \'%s\' file.\n",uVar12);
      NaParams::GetParam((char *)&par);
      NaPNFileOutput::set_output_filename((char *)&csm.cerr_fout);
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 != '\0') {
        pcVar10 = (char *)NaParams::GetParam((char *)&par);
        NaPNStatistics::configure_output((char *)&csm.statan_cerr,pcVar10);
      }
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 != '\0') {
        pcVar10 = (char *)NaParams::GetParam((char *)&par);
        atoi(pcVar10);
        NaPNStatistics::set_floating_gap((int)&csm + 0x14b8);
      }
    }
    cVar1 = NaParams::CheckParam((char *)&par);
    if ((((cVar1 == '\0') || (cVar1 = NaParams::CheckParam((char *)&par), cVar1 == '\0')) ||
        (cVar1 = NaParams::CheckParam((char *)&par), cVar1 == '\0')) ||
       (cVar1 = NaParams::CheckParam((char *)&par), cVar1 == '\0')) {
      NaControlSystemModel::set_tdg_flag(&csm,false);
    }
    else {
      NaControlSystemModel::set_tdg_flag(&csm,true);
      pcVar10 = (char *)NaParams::GetParam((char *)&par);
      iVar5 = atoi(pcVar10);
      pcVar10 = (char *)NaParams::GetParam((char *)&par);
      atoi(pcVar10);
      pcVar10 = (char *)NaParams::GetParam((char *)&par);
      dVar21 = atof(pcVar10);
      pcVar10 = (char *)NaParams::GetParam((char *)&par);
      dVar22 = atof(pcVar10);
      NaPNTrainDataGath::set_parameters((int)&csm + 0x3630,iVar5,dVar21,dVar22);
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 == '\0') {
        NaPNFileOutput::set_output_filename((char *)&csm.tdg_u);
      }
      else {
        NaParams::GetParam((char *)&par);
        NaPNFileOutput::set_output_filename((char *)&csm.tdg_u);
      }
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 == '\0') {
        NaPNFileOutput::set_output_filename((char *)&csm.tdg_ny);
      }
      else {
        NaParams::GetParam((char *)&par);
        NaPNFileOutput::set_output_filename((char *)&csm.tdg_ny);
      }
    }
    putenv("DRAND_SAFE=1");
    reset_rand();
    NaControlSystemModel::set_cusum_flag(&csm,use_cusum);
    NaPrintLog("Cummulative sum detection is %s starting at %g\n",dVar20,pcVar19);
    if (use_cusum != false) {
      NaPNWatcher::attach_function
                ((_func_bool_void_ptr_NaVector_ptr_NaTimer_ptr *)&csm.dodetect,OnDisorderDetection);
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 != '\0') {
        pcVar10 = (char *)NaParams::GetParam((char *)&par);
        atof(pcVar10);
        NaPrintLog("Average time of alarm delay is %g\n");
        pcVar10 = (char *)NaParams::GetParam((char *)&par);
        dVar21 = atof(pcVar10);
        NaPNCuSum::set_smart_detection(dVar21);
      }
    }
    cVar1 = NaParams::CheckParam((char *)&par);
    if (cVar1 != '\0') {
      NaParams::GetParam((char *)&par);
      NaNNUnit::Load((char *)&au_nnp);
      NaPNNNUnit::set_nn_unit((NaNNUnit *)&csm.nnplant);
      NaPNTeacher::set_nn((NaPNNNUnit *)&csm.nnpback,(int)&csm + 0x2528);
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 == '\0') {
        NaPNFileOutput::set_output_filename((char *)&csm.iderr_fout);
      }
      else {
        uVar12 = NaParams::GetParam((char *)&par);
        NaPrintLog("Writing identification error statistics to \'%s\' file.\n",uVar12);
        NaParams::GetParam((char *)&par);
        NaPNFileOutput::set_output_filename((char *)&csm.iderr_fout);
        cVar1 = NaParams::CheckParam((char *)&par);
        if (cVar1 != '\0') {
          pcVar10 = (char *)NaParams::GetParam((char *)&par);
          NaPNStatistics::configure_output((char *)&csm.statan_iderr,pcVar10);
        }
        cVar1 = NaParams::CheckParam((char *)&par);
        if (cVar1 != '\0') {
          pcVar10 = (char *)NaParams::GetParam((char *)&par);
          atoi(pcVar10);
          NaPNStatistics::set_floating_gap((int)&csm + 0x2c90);
        }
      }
      NaNeuralNetDescr::InputDelays();
      NaNeuralNetDescr::OutputDelays();
      NaPNDelay::set_delay((int)&csm + 0x30d0,(uint *)(ulong)local_6050);
      NaPNDelay::set_delay((int)&csm + 0x2f00,(uint *)(ulong)local_604c);
      uVar7 = NaPNDelay::get_max_delay();
      uVar8 = NaPNDelay::get_max_delay();
      uVar17 = (ulong)((uVar8 - uVar7) + 1);
      uVar6 = 0;
      if (uVar8 < uVar7) {
        uVar17 = 0;
        uVar6 = ~uVar8 + uVar7;
      }
      NaPNSkip::set_skip_number((int)&csm + 0x2808);
      NaPNSkip::set_skip_number((int)&csm + 0x2670);
      NaPNFill::set_fill_number((int)&csm + 0x3480);
      NaPNSkip::set_skip_number((int)&csm + 0x3cc0);
      NaPrintLog("delay_u=%d,  skip_u=%d\n",(ulong)uVar7,uVar17);
      NaPrintLog("delay_y=%d,  skip_y=%d\n",(ulong)uVar8,(ulong)uVar6);
      NaPrintLog("delay_r=%d,  skip_r=%d\n",(ulong)(uVar6 + uVar8),(ulong)(uVar6 + uVar8 + 1));
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 == '\0') {
        NaPNFileOutput::set_output_filename((char *)&csm.nn_y);
      }
      else {
        NaParams::GetParam((char *)&par);
        NaPNFileOutput::set_output_filename((char *)&csm.nn_y);
        uVar12 = NaParams::GetParam((char *)&par);
        NaPrintLog("Writing NNP identification output to \'%s\' file.\n",uVar12);
      }
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 == '\0') {
        NaPNFileOutput::set_output_filename((char *)&csm.nn_e);
      }
      else {
        NaParams::GetParam((char *)&par);
        NaPNFileOutput::set_output_filename((char *)&csm.nn_e);
        uVar12 = NaParams::GetParam((char *)&par);
        NaPrintLog("Writing NNP identification error to \'%s\' file.\n",uVar12);
      }
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 == '\0') {
        NaPNFileOutput::set_output_filename((char *)&csm.nnp_bpe);
      }
      else {
        NaParams::GetParam((char *)&par);
        NaPNFileOutput::set_output_filename((char *)&csm.nnp_bpe);
        uVar12 = NaParams::GetParam((char *)&par);
        NaPrintLog("Writing NNP backpropagated error to \'%s\' file.\n",uVar12);
      }
    }
    NaControlSystemModel::link_net(&csm);
    NaParams::GetParam((char *)&par);
    NaPNFileOutput::set_output_filename((char *)&csm.chkpnt_r);
    NaParams::GetParam((char *)&par);
    NaPNFileOutput::set_output_filename((char *)&csm.chkpnt_e);
    NaParams::GetParam((char *)&par);
    NaPNFileOutput::set_output_filename((char *)&csm.chkpnt_u);
    NaParams::GetParam((char *)&par);
    NaPNFileOutput::set_output_filename((char *)&csm.chkpnt_n);
    NaParams::GetParam((char *)&par);
    NaPNFileOutput::set_output_filename((char *)&csm.chkpnt_y);
    NaParams::GetParam((char *)&par);
    NaPNFileOutput::set_output_filename((char *)&csm.chkpnt_ny);
    if (local_6748 == NaNeuralContrERSumE) {
      cVar1 = NaParams::CheckParam((char *)&par);
      uVar6 = 0;
      if (cVar1 != '\0') {
        pcVar10 = (char *)NaParams::GetParam((char *)&par);
        uVar6 = atoi(pcVar10);
      }
      NaPrintLog("Depth of error accumulation is %u\n",(ulong)uVar6);
      NaPNAccumulator::set_accum_depth((int)&csm + 0x1c90);
    }
    if (use_cusum != false) {
      NaParams::GetParam((char *)&par);
      NaPNFileOutput::set_output_filename((char *)&csm.cusum_out);
    }
    if (iVar3 == 0) {
      NaPNRandomGen::set_generator_func((NaUnit *)&csm.setpnt_gen);
      NaPNRandomGen::set_gauss_distrib(0.0,1.0);
      NaPNRandomGen::set_generator_func((NaUnit *)&csm.noise_gen);
      NaPNRandomGen::set_gauss_distrib(0.0,1.0);
    }
    else {
      NaParams::GetParam((char *)&par);
      NaPNFileInput::set_input_filename((char *)&csm.setpnt_inp);
      NaParams::GetParam((char *)&par);
      NaPNFileInput::set_input_filename((char *)&csm.noise_inp);
    }
    NaControlSystemModel::set_initial_cerror(&csm,&vInitial);
    if (iVar2 == 0) {
      NaPNTransfer::set_transfer_func((NaUnit *)&csm.controller);
    }
    else {
      NaPNTransfer::set_transfer_func((NaUnit *)&csm.controller);
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 == '\0') {
        NaPNFileOutput::set_output_filename((char *)&csm.nn_x);
      }
      else {
        NaParams::GetParam((char *)&par);
        NaPNFileOutput::set_output_filename((char *)&csm.nn_x);
      }
    }
    if (use_cusum != false) {
      pcVar10 = (char *)NaParams::GetParam((char *)&par);
      dVar21 = atof(pcVar10);
      pcVar10 = (char *)NaParams::GetParam((char *)&par);
      dVar22 = atof(pcVar10);
      pcVar10 = (char *)NaParams::GetParam((char *)&par);
      dVar23 = atof(pcVar10);
      pcVar10 = (char *)NaParams::GetParam((char *)&par);
      dVar24 = atof(pcVar10);
      NaPNCuSum::setup(dVar21,dVar22,dVar23,dVar24);
      NaPNCuSum::turn_on_at(dVar20);
      cVar1 = NaParams::CheckParam((char *)&par);
      if (cVar1 != '\0') {
        pcVar10 = (char *)NaParams::GetParam((char *)&par);
        iDetectInterval = atoi(pcVar10);
      }
    }
    NVar9 = NaControlSystemModel::run_net(&csm);
    puVar13 = (undefined8 *)NaVector::operator[]((int)&csm + 0x15e0);
    printf("\nMean squared error=%g\n",*puVar13);
    NaPrintLog("IMPORTANT: net is dead due to ");
    pcVar10 = "unknown reason.\n";
    if (NVar9 - pneDead < 4) {
      pcVar10 = &DAT_00109780 + *(int *)(&DAT_00109780 + (ulong)(NVar9 - pneDead) * 4);
    }
    NaPrintLog(pcVar10);
    if (use_cusum != false) {
      printf("Number of disorder detections %d\n",(ulong)(uint)nDisorderCounter);
      NaPrintLog("Number of disorder detections %d\n",(ulong)(uint)nDisorderCounter);
      if (iDetectInterval < 0) {
        plVar14 = (long *)NaPetriNet::timer();
        dVar21 = (double)(**(code **)(*plVar14 + 0x20))(plVar14);
        printf("Average time of false alarm %g\n",dVar21 / (double)nDisorderCounter);
        plVar14 = (long *)NaPetriNet::timer();
        dVar21 = (double)(**(code **)(*plVar14 + 0x20))(plVar14);
        NaPrintLog("Average time of false alarm %g\n",dVar21 / (double)nDisorderCounter);
      }
      else if (iDetectInterval == 0) {
        plVar14 = (long *)NaPetriNet::timer();
        dVar21 = (double)(**(code **)(*plVar14 + 0x20))(plVar14);
        plVar14 = (long *)NaPetriNet::timer();
        (**(code **)(*plVar14 + 0x20))(plVar14);
        NaPrintLog("Time of alarm delay is %g\n");
        local_6740 = local_6740 + (dVar21 - dVar20);
      }
    }
    NaPNStatistics::print_stat((char *)&csm.statan_r,(_IO_FILE *)"Statistics of set point:");
    NaPNStatistics::print_stat((char *)&csm.statan_cerr,(_IO_FILE *)"Statistics of error:");
    plVar14 = (long *)NaPetriNet::timer();
    (**(code **)(*plVar14 + 0x10))(plVar14);
    NaControlSystemModel::~NaControlSystemModel(&csm);
  }
  if ((1 < (int)uVar16) && (iDetectInterval == 0)) {
    printf("Average time of alarm delay %g\n");
    NaPrintLog("Average time of alarm delay %g\n",local_6740 / (double)(int)uVar16);
  }
  NaVector::~NaVector(&vInitial);
  NaNNUnit::~NaNNUnit(&au_nnp);
  NaNNUnit::~NaNNUnit(&au_nnc);
  NaStateSpaceModel::~NaStateSpaceModel(&au_ssmplant);
  NaStateSpaceModel::~NaStateSpaceModel(&au_ssmcontr);
  NaCombinedFunc::~NaCombinedFunc(&au_lincontr);
  NaCombinedFunc::~NaCombinedFunc(&au_linplant);
  NaCombinedFunc::~NaCombinedFunc(&noise_tf);
  NaCombinedFunc::~NaCombinedFunc(&refer_tf);
LAB_00106c57:
  NaParams::~NaParams(&par);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  if(argc < 2)
    {
      fprintf(stderr, "Usage: dcsloop ParamFile [Extra name=value pairs]\n");
      return 1;
    }

  try{
    NaParams	par(argv[1], argc - 2, argv + 2);

    NaPrintLog("Run dcsloop with %s\n", argv[1]);

    par.ListOfParamsToLog();

    /*************************************************************/
    enum {
      linear_contr,
      neural_contr
    }	contr_kind;

    if(!strcmp("lin", par("contr_kind")))
      {
	NaPrintLog("Using linear controller in control system loop\n");
	contr_kind = linear_contr;
      }
    else if(!strcmp("nnc", par("contr_kind")))
      {
	NaPrintLog("Using neural net controller in control system loop\n");
	contr_kind = neural_contr;
      }
    else
      {
	NaPrintLog("Bad or undefined contr_kind value in .par file\n");
	return 0;
      }

    /*************************************************************/
    enum {
      stream_mode,
      file_mode
    }	inp_data_mode;

    if(!strcmp("stream", par("input_kind")))
      {
	NaPrintLog("Using stream reference and noise (transfer functions)\n");
	inp_data_mode = stream_mode;
      }
    else if(!strcmp("file", par("input_kind")))
      {
	NaPrintLog("Using limited reference and noise series (data files)\n");
	inp_data_mode = file_mode;
      }
    else
      {
	NaPrintLog("Bad or undefined input_kind value in .par file\n");
	return 0;
      }


    /*************************************************************/
    // Applied units
    NaCombinedFunc	refer_tf;
    NaCombinedFunc	noise_tf;
    NaCombinedFunc	au_linplant;
    NaCombinedFunc	au_lincontr;
    NaStateSpaceModel	au_ssmcontr;
    NaStateSpaceModel	au_ssmplant;
    enum { TForCOF, SSModel } ePlantType, eContrType;
    NaNNUnit		au_nnc, au_nnp;


    // Load plant
    const char *szFileName = par("linplant_tf");
    if(!strcmp(szFileName + strlen(szFileName) - 4, ".ssm")) {
      au_ssmplant.Load(szFileName);
      ePlantType = SSModel;
    } else {
      // Otherwise let's try combined/transfer function
      au_linplant.Load(szFileName);
      ePlantType = TForCOF;
    }

    // Initial value of control error comparator
    NaVector	vInitial(1);

    // Type of controller
    NaControllerKind	ckind;

    // Load controller
    switch(contr_kind)
      {
      case linear_contr:
        {
	    // Load plant
	    const char *szFileName = par("lincontr_tf");
	    if(!strcmp(szFileName + strlen(szFileName) - 4, ".ssm")) {
		au_ssmcontr.Load(szFileName);
		eContrType = SSModel;
	    } else {
		// Otherwise let's try combined/transfer function
		au_lincontr.Load(szFileName);
		eContrType = TForCOF;
	    }

	    vInitial.init_zero();
	    if(par.CheckParam("cerror_initial_value"))
		vInitial.init_value(atof(par("cerror_initial_value")));
	    else if(par.CheckParam("plant_initial_state"))
		// old and wrong name for cerror_initial_value semantics
		vInitial.init_value(atof(par("plant_initial_state")));
	    ckind = NaLinearContr;
	}
	break;

      case neural_contr:
	au_nnc.Load(par("nncontr"));

	// Interpret NN-C structure

	// Default rule
	if(au_nnc.descr.nInputsRepeat > 1)
	  ckind = NaNeuralContrDelayedE;
	else
	  ckind = NaNeuralContrER;

	// Explicit rule
	{
	    const char *nnc_mode = par("nnc_mode");
	    if(!strcmp(nnc_mode, "e+r+se") ||
	       !strcmp(nnc_mode, "r+e+se"))
		ckind = NaNeuralContrERSumE;
	    else if(!strcmp(nnc_mode, "e+r") ||
		    !strcmp(nnc_mode, "r+e"))
		ckind = NaNeuralContrER;
	    else if(!strcmp(nnc_mode, "e+de"))
		ckind = NaNeuralContrEdE;
	    else if(!strcmp(nnc_mode, "e+e+..."))
		ckind = NaNeuralContrDelayedE;
	}
	break;
      }

    // Load input data
    int	len;
    switch(inp_data_mode)
      {
      case stream_mode:
	refer_tf.Load(par("refer_tf"));
	noise_tf.Load(par("noise_tf"));
	len = atoi(par("stream_len"));
	break;
      case file_mode:
	len = 0;
	break;
      }

    bool	bUseCuSum = par.CheckParam("cusum");
    int		nRuns = atoi(par("cusum_atad"));
    NaReal	fStartTime = atof(par("cusum_start_time"));
    if(fStartTime < 0.0)
      fStartTime= 0.0;
    if(bUseCuSum && nRuns <= 0 || !bUseCuSum)
      nRuns = 1;
    NaReal	fTotalTime = 0.0;
       
    for(int iRun = 0; iRun < nRuns; ++iRun)
      {
	NaPrintLog("Run %d (of %d)\n", 1+iRun, nRuns);
	NaControlSystemModel	csm(len, ckind);

	// Plant
	switch(ePlantType)
	  {
	  case TForCOF:
	    NaPrintLog("plant TF or COF function\n");
	    csm.set_plant_function(au_linplant);
	    break;

	  case SSModel:
	    NaPrintLog("plant SS model\n");
	    csm.set_plant_ss_model(au_ssmplant);
	    if(par.CheckParam("out_x"))
	      csm.plant_x.set_output_filename(par("out_x"));
	    else {
		NaPrintLog("Warning: 'out_x' parameter is not defined, 'out_x_default.dat' file is used");
		csm.plant_x.set_output_filename("out_x_default.dat");
	    }
	    break;
	  }

	if(par.CheckParam("cerr_trace_file")) {
	    NaPrintLog("Writing control error statistics to '%s' file.\n",
		       par("cerr_trace_file"));
	    csm.cerr_fout.set_output_filename(par("cerr_trace_file"));
	    if(par.CheckParam("cerr_trace_contents")) {
		csm.statan_cerr.configure_output(par("cerr_trace_contents"));
	    }
	    if(par.CheckParam("cerr_avg_base")) {
		csm.statan_cerr.set_floating_gap(atoi(par("cerr_avg_base")));
	    }
	} else {
	    csm.cerr_fout.set_output_filename(DEV_NULL);
	}

	if(par.CheckParam("tdg_stpardet_len") &&
	   par.CheckParam("tdg_cells") &&
	   par.CheckParam("tdg_sigma_num") &&
	   par.CheckParam("tdg_cover_percent"))
	  {
	    csm.set_tdg_flag(true);
	    csm.trdgath.set_parameters(atoi(par("tdg_stpardet_len")),
				       atoi(par("tdg_cells")),
				       atof(par("tdg_sigma_num")),
				       atof(par("tdg_cover_percent")));

	    if(par.CheckParam("tdg_u"))
	      csm.tdg_u.set_output_filename(par("tdg_u"));
	    else
	      csm.tdg_u.set_output_filename(DEV_NULL);
	    if(par.CheckParam("tdg_ny"))
	      csm.tdg_ny.set_output_filename(par("tdg_ny"));
	    else
	      csm.tdg_ny.set_output_filename(DEV_NULL);
	  }
	else
	  csm.set_tdg_flag(false);

	// Reset pseudo-random sequence
	putenv("DRAND_SAFE=1");
	reset_rand();

	// Set cummulative sum method is turned on or off
	csm.set_cusum_flag(bUseCuSum);
	NaPrintLog("Cummulative sum detection is %s starting at %g\n",
		   bUseCuSum? "ON": "OFF", fStartTime);
	if(bUseCuSum)
	  {
	    csm.dodetect.attach_function(OnDisorderDetection);
	    if(par.CheckParam("atad"))
	      {
		NaPrintLog("Average time of alarm delay is %g\n",
			   atof(par("atad")));
		csm.cusum.set_smart_detection(atof(par("atad")));
	      }
	  }

	// Setup parameters for NN-P
	if(par.CheckParam("in_nnp_file"))
	  {
	    //au_nnp.SetInstance("Plant");
	    au_nnp.Load(par("in_nnp_file"));
	    csm.nnplant.set_nn_unit(&au_nnp);
	    csm.nnpback.set_nn(&csm.nnplant);

	    if(par.CheckParam("iderr_trace_file")) {
		NaPrintLog("Writing identification error statistics to '%s' file.\n",
			   par("iderr_trace_file"));
		csm.iderr_fout.set_output_filename(par("iderr_trace_file"));
		if(par.CheckParam("iderr_trace_contents")) {
		    csm.statan_iderr
			.configure_output(par("iderr_trace_contents"));
		}
		if(par.CheckParam("iderr_avg_base")) {
		    csm.statan_iderr
			.set_floating_gap(atoi(par("iderr_avg_base")));
		}
	    } else {
		csm.iderr_fout.set_output_filename(DEV_NULL);
	    }

	    // Get NNP delays
	    unsigned	*input_delays = au_nnp.descr.InputDelays();
	    unsigned	*output_delays = au_nnp.descr.OutputDelays();

	    // Configure nodes
	    csm.delay_u.set_delay(au_nnp.descr.nInputsRepeat, input_delays);
	    csm.delay_y.set_delay(au_nnp.descr.nOutputsRepeat, output_delays);

	    unsigned	iDelay_u = csm.delay_u.get_max_delay();
	    unsigned	iDelay_y = csm.delay_y.get_max_delay();
	    unsigned	iSkip_u = 0, iSkip_y = 0;
	    unsigned	iDelay_e, iSkip_e;

	    // Skip u or y due to absent earlier values of y or u
	    if(iDelay_y >= iDelay_u)
	      {
		iSkip_u = iDelay_y - iDelay_u + 1;
	      }
	    else /* if(iDelay_u > iDelay_y) */
	      {
		iSkip_y = iDelay_u - iDelay_y - 1;
	      }
	    iDelay_e = iDelay_y + iSkip_y;
	    iSkip_e = 1 + iDelay_e;

	    csm.skip_u.set_skip_number(iSkip_u);
	    csm.skip_y.set_skip_number(iSkip_y);
	    csm.fill_nn_y.set_fill_number(iSkip_e);

	    // Additional delay for target value
	    csm.skip_r.set_skip_number(1 + iSkip_e);

	    NaPrintLog("delay_u=%d,  skip_u=%d\n", iDelay_u, iSkip_u);
	    NaPrintLog("delay_y=%d,  skip_y=%d\n", iDelay_y, iSkip_y);
	    NaPrintLog("delay_r=%d,  skip_r=%d\n", iDelay_e, iSkip_e);

	    if(par.CheckParam("out_nn_y")) {
		csm.nn_y.set_output_filename(par("out_nn_y"));
		NaPrintLog("Writing NNP identification output to '%s' file.\n",
			   par("out_nn_y"));
	    } else {
		csm.nn_y.set_output_filename(DEV_NULL);
	    }

	    if(par.CheckParam("out_nn_e")) {
		csm.nn_e.set_output_filename(par("out_nn_e"));
		NaPrintLog("Writing NNP identification error to '%s' file.\n",
			   par("out_nn_e"));
	    } else {
		csm.nn_e.set_output_filename(DEV_NULL);
	    }

	    if(par.CheckParam("out_nnp_bpe")) {
		csm.nnp_bpe.set_output_filename(par("out_nnp_bpe"));
		NaPrintLog("Writing NNP backpropagated error to '%s' file.\n",
			   par("out_nnp_bpe"));
	    } else {
		csm.nnp_bpe.set_output_filename(DEV_NULL);
	    }
	  }

	// Link the network
	csm.link_net();

	// Configure nodes
	csm.chkpnt_r.set_output_filename(par("out_r"));
	csm.chkpnt_e.set_output_filename(par("out_e"));
	csm.chkpnt_u.set_output_filename(par("out_u"));
	csm.chkpnt_n.set_output_filename(par("out_n"));
	csm.chkpnt_y.set_output_filename(par("out_y"));
	csm.chkpnt_ny.set_output_filename(par("out_ny"));

	if(NaNeuralContrERSumE == ckind) {
	    int nErrAccDepth = 0; // pure integration
	    if(par.CheckParam("err_acc_depth"))
		nErrAccDepth = atoi(par("err_acc_depth"));
	    NaPrintLog("Depth of error accumulation is %u\n", nErrAccDepth);
	    csm.err_acc.set_accum_depth(nErrAccDepth);
	}

	if(bUseCuSum)
	  csm.cusum_out.set_output_filename(par("cusum"));
      
	// Setpoint and noise
	NaReal	fMean = 0.0, fStdDev = 1.0;

	switch(inp_data_mode)
	  {
	  case stream_mode:
	    csm.setpnt_gen.set_generator_func(&refer_tf);
	    csm.setpnt_gen.set_gauss_distrib(fMean, fStdDev);

	    csm.noise_gen.set_generator_func(&noise_tf);
	    csm.noise_gen.set_gauss_distrib(fMean, fStdDev);
	    break;
	  case file_mode:
	    csm.setpnt_inp.set_input_filename(par("in_r"));
	    csm.noise_inp.set_input_filename(par("in_n"));
	    break;
	  }

	csm.set_initial_cerror(vInitial);

	// Controller
	switch(contr_kind)
	  {
	  case linear_contr:
	    if(SSModel == eContrType)
		csm.controller.set_transfer_func(&au_ssmcontr);
	    else
		csm.controller.set_transfer_func(&au_lincontr);
	    break;

	  case neural_contr:
	    csm.controller.set_transfer_func(&au_nnc);

	    if(par.CheckParam("nn_x"))
		csm.nn_x.set_output_filename(par("nn_x"));
	    else
		csm.nn_x.set_output_filename(DEV_NULL);
	    break;
	  }

	// Setup parameters for CUSUM (disorder detection)
	if(bUseCuSum)
	  {
	    csm.cusum.setup(atof(par("sigma0")), atof(par("sigma1")),
			    atof(par("h_sol")), atof(par("k_const")));
	    csm.cusum.turn_on_at(fStartTime);

	    if(par.CheckParam("detect_interval"))
	      iDetectInterval = atoi(par("detect_interval"));
	  }

	NaPNEvent   pnev = csm.run_net();

	printf("\nMean squared error=%g\n", csm.statan_cerr.RMS[0]);

	NaPrintLog("IMPORTANT: net is dead due to ");
	switch(pnev){
	case pneTerminate:
	  NaPrintLog("user break.\n");
	  break;

	case pneHalted:
	  NaPrintLog("internal halt.\n");
	  break;

	case pneDead:
	  NaPrintLog("data are exhausted.\n");
	  break;

	case pneError:
	  NaPrintLog("some error occured.\n");
	  break;

	default:
	  NaPrintLog("unknown reason.\n");
	  break;
	}

	if(bUseCuSum)
	  {
	    printf("Number of disorder detections %d\n", nDisorderCounter);
	    NaPrintLog("Number of disorder detections %d\n", nDisorderCounter);

	    if(iDetectInterval < 0)
	      {
		printf("Average time of false alarm %g\n",
		       csm.net.timer().CurrentTime()/nDisorderCounter);
		NaPrintLog("Average time of false alarm %g\n",
			   csm.net.timer().CurrentTime()/nDisorderCounter);
	      }
	    else if(iDetectInterval == 0)
	      {
		fTotalTime += csm.net.timer().CurrentTime() - fStartTime;
		NaPrintLog("Time of alarm delay is %g\n",
			   csm.net.timer().CurrentTime());
	      }
	  }
     
#if 0
	// Maximum absolute value of an set point
	NaReal  aMax_u;
	if(fabs(csm.statan_u.Min[0]) > fabs(csm.statan_u.Max[0])){
	  aMax = csm.statan_u.Min[0];
	}else{
	  aMax = csm.statan_u.Max[0];
	}
#endif

	csm.statan_r.print_stat("Statistics of set point:");
	csm.statan_cerr.print_stat("Statistics of error:");

	csm.net.timer().ResetTime();

      }/* End of numerous runs */

    if(nRuns > 1 && iDetectInterval == 0)
      {
	printf("Average time of alarm delay %g\n", fTotalTime / nRuns);
	NaPrintLog("Average time of alarm delay %g\n", fTotalTime / nRuns);
      }
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
    fprintf(stderr, "EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}